

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

bool __thiscall Memory::HeapInfo::AllocatorsAreEmpty(HeapInfo *this)

{
  bool bVar1;
  ulong uVar2;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_00;
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_01;
  ulong uVar3;
  
  bVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty(this->heapBuckets);
  if (bVar1) {
    this_01 = this->heapBuckets;
    uVar3 = 0xffffffffffffffff;
    do {
      this_01 = this_01 + 1;
      if (uVar3 == 0x2e) goto LAB_006ec674;
      bVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty(this_01);
      uVar3 = uVar3 + 1;
    } while (bVar1);
    if (0x2e < uVar3) {
LAB_006ec674:
      bVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty
                        (this->mediumHeapBuckets);
      if (bVar1) {
        this_00 = this->mediumHeapBuckets;
        uVar3 = 0;
        do {
          uVar2 = uVar3;
          this_00 = this_00 + 1;
          if (uVar2 == 0x1c) break;
          bVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty(this_00);
          uVar3 = uVar2 + 1;
        } while (bVar1);
        return 0x1b < uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool
HeapInfo::AllocatorsAreEmpty()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        if (!heapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        if (!mediumHeapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#endif

    return true;
}